

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int aead_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv,EVP_CIPHER *cipher)

{
  EVP_CIPHER_CTX *pEVar1;
  void *in_RCX;
  uchar *in_RDX;
  int in_ESI;
  long *in_RDI;
  EVP_CIPHER *in_R8;
  int ret;
  aead_crypto_context_t *ctx;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  
  memcpy(in_RDI + 9,in_RCX,*(size_t *)(*in_RDI + 0x30));
  if (in_RDX == (uchar *)0x0) {
    return 0;
  }
  in_RDI[1] = (long)aead_dispose_crypto;
  in_RDI[2] = (long)aead_xor_iv;
  if (in_ESI == 0) {
    in_RDI[3] = 0;
    in_RDI[4] = 0;
    in_RDI[5] = 0;
    in_RDI[7] = (long)aead_do_decrypt;
  }
  else {
    in_RDI[3] = (long)aead_do_encrypt_init;
    in_RDI[4] = (long)aead_do_encrypt_update;
    in_RDI[5] = (long)aead_do_encrypt_final;
    in_RDI[6] = (long)ptls_aead__do_encrypt;
    in_RDI[7] = 0;
  }
  in_RDI[8] = 0;
  pEVar1 = EVP_CIPHER_CTX_new();
  in_RDI[8] = (long)pEVar1;
  if (pEVar1 == (EVP_CIPHER_CTX *)0x0) {
    iVar2 = 0x201;
  }
  else {
    if (in_ESI == 0) {
      iVar2 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)in_RDI[8],in_R8,(ENGINE *)0x0,in_RDX,(uchar *)0x0
                                );
      if (iVar2 == 0) {
        iVar2 = 0x203;
        goto LAB_00107dec;
      }
    }
    else {
      iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)in_RDI[8],in_R8,(ENGINE *)0x0,in_RDX,(uchar *)0x0
                                );
      if (iVar2 == 0) {
        iVar2 = 0x203;
        goto LAB_00107dec;
      }
    }
    iVar2 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)in_RDI[8],9,(int)*(undefined8 *)(*in_RDI + 0x30),
                                (void *)0x0);
    if (iVar2 != 0) {
      return 0;
    }
    iVar2 = 0x203;
  }
LAB_00107dec:
  aead_dispose_crypto((ptls_aead_context_t *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
  return iVar2;
}

Assistant:

static int aead_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv, const EVP_CIPHER *cipher)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    int ret;

    memcpy(ctx->static_iv, iv, ctx->super.algo->iv_size);
    if (key == NULL)
        return 0;

    ctx->super.dispose_crypto = aead_dispose_crypto;
    ctx->super.do_xor_iv = aead_xor_iv;
    if (is_enc) {
        ctx->super.do_encrypt_init = aead_do_encrypt_init;
        ctx->super.do_encrypt_update = aead_do_encrypt_update;
        ctx->super.do_encrypt_final = aead_do_encrypt_final;
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_decrypt = aead_do_decrypt;
    }
    ctx->evp_ctx = NULL;

    if ((ctx->evp_ctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    if (is_enc) {
        if (!EVP_EncryptInit_ex(ctx->evp_ctx, cipher, NULL, key, NULL)) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
    } else {
        if (!EVP_DecryptInit_ex(ctx->evp_ctx, cipher, NULL, key, NULL)) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
    }
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_IVLEN, (int)ctx->super.algo->iv_size, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Error;
    }

    return 0;

Error:
    aead_dispose_crypto(&ctx->super);
    return ret;
}